

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_stroke_triangle
               (nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_vec2 c,nk_color col,float thickness)

{
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x1d57,
                  "void nk_draw_list_stroke_triangle(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, struct nk_vec2, struct nk_color, float)"
                 );
  }
  if ((uint)col < 0x1000000) {
    return;
  }
  nk_draw_list_path_line_to(list,a);
  nk_draw_list_path_line_to(list,b);
  nk_draw_list_path_line_to(list,c);
  nk_draw_list_path_stroke(list,col,NK_STROKE_CLOSED,thickness);
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_triangle(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, struct nk_vec2 c, struct nk_color col, float thickness)
{
    NK_ASSERT(list);
    if (!list || !col.a) return;
    nk_draw_list_path_line_to(list, a);
    nk_draw_list_path_line_to(list, b);
    nk_draw_list_path_line_to(list, c);
    nk_draw_list_path_stroke(list, col, NK_STROKE_CLOSED, thickness);
}